

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

void glfwSetTime(double time)

{
  uint64_t uVar1;
  uint64_t uVar2;
  ulong uVar3;
  double in_XMM0_Qa;
  double dVar4;
  undefined1 auVar5 [16];
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if ((in_XMM0_Qa < 0.0) || (18446744073.0 < in_XMM0_Qa)) {
    _glfwInputError((int)in_XMM0_Qa,(char *)0x10004,"Invalid time %f");
  }
  else {
    uVar1 = _glfwPlatformGetTimerValue();
    uVar2 = _glfwPlatformGetTimerFrequency();
    auVar5._8_4_ = (int)(uVar2 >> 0x20);
    auVar5._0_8_ = uVar2;
    auVar5._12_4_ = 0x45300000;
    dVar4 = in_XMM0_Qa *
            ((auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
    uVar3 = (ulong)dVar4;
    _glfw.timer.offset =
         uVar1 - (uVar3 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f);
  }
  return;
}

Assistant:

GLFWAPI void glfwSetTime(double time)
{
    _GLFW_REQUIRE_INIT();

    if (time != time || time < 0.0 || time > 18446744073.0)
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Invalid time %f", time);
        return;
    }

    _glfw.timer.offset = _glfwPlatformGetTimerValue() -
        (uint64_t) (time * _glfwPlatformGetTimerFrequency());
}